

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O1

ostream * Minisat::operator<<(ostream *out,vec<Minisat::Lit> *cls)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  
  if (0 < cls->sz) {
    lVar4 = 0;
    do {
      uVar1 = cls->data[lVar4].x;
      uVar3 = (int)uVar1 >> 1;
      uVar2 = ~uVar3;
      if ((uVar1 & 1) == 0) {
        uVar2 = uVar3 + 1;
      }
      std::ostream::operator<<((ostream *)out,uVar2);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
      lVar4 = lVar4 + 1;
    } while (lVar4 < cls->sz);
  }
  return out;
}

Assistant:

inline std::ostream &operator<<(std::ostream &out, const vec<T> &cls)
{
    for (int i = 0; i < cls.size(); ++i) {
        out << cls[i] << " ";
    }

    return out;
}